

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Vec_Wec_t *
Acec_FindXorLeaves(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vAdds,Vec_Int_t *vXorRoots,
                  Vec_Int_t *vRanks,Vec_Wec_t **pvAddBoxes)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Bit_t *__ptr;
  Vec_Int_t *__ptr_00;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint local_94;
  ulong local_88;
  Vec_Int_t *local_70;
  
  __ptr = Acec_MapXorOuts2(p,vXors,vRanks);
  __ptr_00 = Acec_MapMajOuts2(p,vAdds,vRanks);
  uVar11 = vXorRoots->nSize;
  local_88 = (ulong)uVar11;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  local_94 = 8;
  if (6 < uVar11 - 1) {
    local_94 = uVar11;
  }
  pVVar6->nCap = local_94;
  if (local_94 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)(int)local_94,0x10);
  }
  pVVar6->pArray = pVVar7;
  pVVar6->nSize = uVar11;
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  pVVar8->nCap = local_94;
  if (local_94 == 0) {
    local_70 = (Vec_Int_t *)0x0;
  }
  else {
    local_70 = (Vec_Int_t *)calloc((long)(int)local_94,0x10);
  }
  pVVar8->pArray = local_70;
  pVVar8->nSize = uVar11;
  iVar5 = vXors->nSize;
  if (0 < iVar5) {
    uVar11 = 0;
    do {
      uVar15 = (ulong)uVar11;
      iVar1 = vXors->pArray[uVar15];
      lVar12 = (long)iVar1;
      if ((lVar12 < 0) || (vRanks->nSize <= iVar1)) {
LAB_0068e44b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = vRanks->pArray[lVar12];
      uVar14 = (ulong)uVar2;
      if (uVar14 != 0xffffffff) {
        iVar5 = uVar2 + 1;
        lVar13 = 3;
        do {
          uVar15 = uVar15 + 1;
          if (vXors->nSize <= (int)uVar15) goto LAB_0068e44b;
          uVar10 = vXors->pArray[uVar15];
          uVar9 = (ulong)uVar10;
          if (uVar9 != 0) {
            if (((int)uVar10 < 0) || (__ptr->nSize <= (int)uVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if (((uint)__ptr->pArray[uVar10 >> 5] >> (uVar10 & 0x1f) & 1) == 0) {
              if (__ptr_00->nSize <= (int)uVar10) goto LAB_0068e44b;
              uVar3 = __ptr_00->pArray[uVar9];
              if (uVar3 == 0xffffffff) {
                iVar16 = pVVar6->nSize;
                if (iVar16 <= (int)uVar2) {
                  iVar4 = iVar16 * 2;
                  if (iVar16 * 2 <= iVar5) {
                    iVar4 = iVar5;
                  }
                  iVar16 = pVVar6->nCap;
                  if (iVar16 < iVar4) {
                    if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                      pVVar7 = (Vec_Int_t *)malloc((long)iVar4 << 4);
                    }
                    else {
                      pVVar7 = (Vec_Int_t *)realloc(pVVar6->pArray,(long)iVar4 << 4);
                    }
                    pVVar6->pArray = pVVar7;
                    memset(pVVar7 + iVar16,0,(long)(iVar4 - iVar16) << 4);
                    pVVar6->nCap = iVar4;
                  }
                  pVVar6->nSize = iVar5;
                  iVar16 = iVar5;
                }
                if (((int)uVar2 < 0) || (iVar16 <= (int)uVar2)) {
LAB_0068e4a8:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                }
                pVVar7 = pVVar6->pArray + uVar14;
              }
              else {
                if (vRanks->nSize <= iVar1) goto LAB_0068e44b;
                if (vRanks->pArray[lVar12] < 1) goto LAB_0068e3c9;
                if ((int)local_88 < (int)uVar2) {
                  uVar10 = (int)local_88 * 2;
                  if ((int)uVar10 <= (int)uVar2) {
                    uVar10 = uVar2;
                  }
                  if ((int)local_94 < (int)uVar10) {
                    if (local_70 == (Vec_Int_t *)0x0) {
                      local_70 = (Vec_Int_t *)malloc((long)(int)uVar10 << 4);
                    }
                    else {
                      local_70 = (Vec_Int_t *)realloc(local_70,(long)(int)uVar10 << 4);
                      local_94 = pVVar8->nCap;
                    }
                    pVVar8->pArray = local_70;
                    memset(local_70 + (int)local_94,0,(long)(int)(uVar10 - local_94) << 4);
                    pVVar8->nCap = uVar10;
                    local_94 = uVar10;
                  }
                  pVVar8->nSize = uVar2;
                  local_88 = uVar14;
                }
                if (((int)uVar2 < 1) || ((int)local_88 < (int)uVar2)) goto LAB_0068e4a8;
                pVVar7 = local_70 + (uVar14 - 1);
                uVar10 = uVar3;
              }
              Vec_IntPush(pVVar7,uVar10);
            }
            else {
              if (vRanks->nSize <= (int)uVar10) goto LAB_0068e44b;
              if (uVar2 != vRanks->pArray[uVar9]) {
                __assert_fail("Rank == Vec_IntEntry(vRanks, Fanin)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecXor.c"
                              ,0xf8,
                              "Vec_Wec_t *Acec_FindXorLeaves(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t **)"
                             );
              }
            }
          }
LAB_0068e3c9:
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
        iVar5 = vXors->nSize;
      }
      uVar11 = uVar11 + 4;
    } while ((int)uVar11 < iVar5);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (pvAddBoxes != (Vec_Wec_t **)0x0) {
    *pvAddBoxes = pVVar8;
  }
  return pVVar6;
}

Assistant:

Vec_Wec_t * Acec_FindXorLeaves( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vAdds, Vec_Int_t * vXorRoots, Vec_Int_t * vRanks, Vec_Wec_t ** pvAddBoxes )
{
    Vec_Bit_t * vMapXors = Acec_MapXorOuts2( p, vXors, vRanks );
    Vec_Int_t * vMapMajs = Acec_MapMajOuts2( p, vAdds, vRanks );
    Vec_Wec_t * vXorLeaves = Vec_WecStart( Vec_IntSize(vXorRoots) );
    Vec_Wec_t * vAddBoxes  = Vec_WecStart( Vec_IntSize(vXorRoots) );
    int i, k;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        int Xor = Vec_IntEntry(vXors, 4*i);
        int Rank = Vec_IntEntry(vRanks, Xor);
        if ( Rank == -1 )
            continue;
        for ( k = 1; k < 4; k++ )
        {
            int Fanin = Vec_IntEntry(vXors, 4*i+k);
            //int RankFanin = Vec_IntEntry(vRanks, Fanin);
            if ( Fanin == 0 )
                continue;
            if ( Vec_BitEntry(vMapXors, Fanin) )
            {
                assert( Rank == Vec_IntEntry(vRanks, Fanin) );
                continue;
            }
//            if ( Vec_BitEntry(vMapXors, Fanin) && Rank == RankFanin )
//                continue;
            if ( Vec_IntEntry(vMapMajs, Fanin) == -1 ) // no adder driving this input
                Vec_WecPush( vXorLeaves, Rank, Fanin );
            else if ( Vec_IntEntry(vRanks, Xor) > 0 ) // save adder box
                Vec_WecPush( vAddBoxes, Rank-1, Vec_IntEntry(vMapMajs, Fanin) );
        }
    }
    Vec_BitFree( vMapXors );
    Vec_IntFree( vMapMajs );
    if ( pvAddBoxes )
        *pvAddBoxes = vAddBoxes;
    return vXorLeaves;
}